

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O2

void print_db_stats(fdb_file_handle **dbfiles,int nfiles)

{
  fdb_status fVar1;
  StatAggregator *this;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong local_50;
  fdb_latency_stat stat;
  
  this = (StatAggregator *)operator_new(0x10);
  StatAggregator::StatAggregator(this,0x13,1);
  lVar3 = 0;
  uVar4 = 0;
  if (0 < nfiles) {
    uVar4 = (ulong)(uint)nfiles;
  }
  do {
    if (lVar3 == 0x13) {
      StatAggregator::aggregateAndPrintStats(this,"FDB_STATS",nfiles,"ms");
      StatAggregator::~StatAggregator(this);
      operator_delete(this);
      return;
    }
    fdb_latency_stat_name((fdb_latency_stat_type)lVar3);
    std::__cxx11::string::assign((char *)this->t_stats[lVar3]);
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      stat.lat_count = 0;
      stat.lat_min = 0;
      stat.lat_max = 0;
      stat.lat_avg = 0;
      stat._20_4_ = 0;
      fVar1 = fdb_get_latency_stats(dbfiles[uVar2],&stat,(fdb_latency_stat_type)lVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x41,"void print_db_stats(fdb_file_handle **, int)");
      }
      if (stat.lat_count != 0) {
        local_50 = stat._16_8_ & 0xffffffff;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&this->t_stats[lVar3]->latencies,&local_50);
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void print_db_stats(fdb_file_handle **dbfiles, int nfiles) {

    int i, j;
    fdb_status status;
    fdb_latency_stat stat;
    int nstats = FDB_LATENCY_NUM_STATS;

    StatAggregator *sa = new StatAggregator(nstats, 1);

    for (i = 0; i < nstats; i++) {
        const char* name = fdb_latency_stat_name(i);
        sa->t_stats[i][0].name = name;

        for (j = 0; j < nfiles; j++) {
            memset(&stat, 0, sizeof(fdb_latency_stat));
            status = fdb_get_latency_stats(dbfiles[j], &stat, i);
            assert(status == FDB_RESULT_SUCCESS);

            if (stat.lat_count > 0) {
                sa->t_stats[i][0].latencies.push_back(stat.lat_avg);
            }
        }
    }
    (void)status;

    sa->aggregateAndPrintStats("FDB_STATS", nfiles, "ms");
    delete sa;
}